

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmTextureOffset.cpp
# Opt level: O1

void __thiscall
GmmLib::GmmTextureCalc::AlignTexHeightWidth
          (GmmTextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,uint32_t *pHeight,uint32_t *pWidth)

{
  uint uVar1;
  uint uVar2;
  uint8_t uVar3;
  uint uVar4;
  uint uVar5;
  uint local_54;
  uint local_50;
  uint32_t CompressHeight;
  uint32_t CompressWidth;
  uint32_t CompressDepth;
  uint *local_40;
  uint *local_38;
  
  if ((((pHeight != (uint32_t *)0x0) && (pTexInfo != (GMM_TEXTURE_INFO *)0x0)) &&
      (pWidth != (uint32_t *)0x0)) && (this->pGmmLibContext != (Context *)0x0)) {
    uVar5 = *pWidth;
    uVar4 = *pHeight;
    uVar1 = (pTexInfo->Alignment).HAlign;
    uVar2 = (pTexInfo->Alignment).VAlign;
    _CompressWidth = this;
    local_40 = pWidth;
    local_38 = pHeight;
    uVar3 = GmmIsCompressed(this->pGmmLibContext,pTexInfo->Format);
    if (uVar5 <= uVar1) {
      uVar5 = uVar1;
    }
    if (uVar4 <= uVar2) {
      uVar4 = uVar2;
    }
    uVar5 = -uVar1 & (uVar1 - 1) + uVar5;
    uVar4 = -uVar2 & (uVar2 - 1) + uVar4;
    if (uVar3 == '\0') {
      if ((((pTexInfo->Flags).Gpu.field_0x3 & 0x20) != 0) &&
         (((pTexInfo->Flags).Info.field_0x4 & 4) != 0)) {
        uVar5 = uVar5 * 2;
        uVar4 = uVar4 >> 1;
      }
    }
    else {
      GetCompressionBlockDimensions
                (_CompressWidth,pTexInfo->Format,&local_50,&local_54,&CompressHeight);
      uVar5 = uVar5 / local_50;
      uVar4 = uVar4 / local_54;
    }
    *local_38 = uVar4;
    *local_40 = uVar5;
  }
  return;
}

Assistant:

void GmmLib::GmmTextureCalc::AlignTexHeightWidth(GMM_TEXTURE_INFO *pTexInfo,
                                                 uint32_t *        pHeight,
                                                 uint32_t *        pWidth)
{
    uint32_t MipWidth        = 0;
    uint32_t MipHeight       = 0;
    uint32_t UnitAlignHeight = 0;
    uint32_t UnitAlignWidth  = 0;

    uint8_t Compress = 0;

    __GMM_ASSERTPTR(pTexInfo, VOIDRETURN);
    __GMM_ASSERTPTR(pWidth, VOIDRETURN);
    __GMM_ASSERTPTR(pHeight, VOIDRETURN);
    __GMM_ASSERTPTR(pGmmLibContext, VOIDRETURN);

    MipWidth  = *pWidth;
    MipHeight = *pHeight;

    UnitAlignWidth  = pTexInfo->Alignment.HAlign;
    UnitAlignHeight = pTexInfo->Alignment.VAlign;
    Compress        = GmmIsCompressed(pGmmLibContext, pTexInfo->Format);

    MipWidth  = GFX_MAX(MipWidth, UnitAlignWidth);
    MipHeight = GFX_MAX(MipHeight, UnitAlignHeight);

    MipWidth  = GFX_ALIGN(MipWidth, UnitAlignWidth);
    MipHeight = GFX_ALIGN(MipHeight, UnitAlignHeight);

    if(Compress)
    {
        uint32_t CompressHeight, CompressWidth, CompressDepth;
        GetCompressionBlockDimensions(pTexInfo->Format, &CompressWidth, &CompressHeight, &CompressDepth);
        MipWidth /= CompressWidth;
        MipHeight /= CompressHeight;
    }
    else if(pTexInfo->Flags.Gpu.SeparateStencil && pTexInfo->Flags.Info.TiledW)
    {
        MipWidth *= 2;
        MipHeight /= 2;
    }

    *pHeight = MipHeight;
    *pWidth  = MipWidth;
}